

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O2

string * jsonnet::internal::encode_utf8(string *__return_storage_ptr__,UString *s)

{
  pointer pcVar1;
  size_type sVar2;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  for (lVar3 = 0; sVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    encode_utf8(*(char32_t *)((long)pcVar1 + lVar3),__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string encode_utf8(const UString &s)
{
    std::string r;
    encode_utf8(s, r);
    return r;
}